

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O1

Ref trun::DynLibLinux::Create(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ref RVar1;
  undefined1 local_29;
  DynLibLinux *local_28;
  Version local_20;
  
  local_28 = (DynLibLinux *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trun::DynLibLinux,std::allocator<trun::DynLibLinux>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_20,&local_28,
             (allocator<trun::DynLibLinux> *)&local_29);
  in_RDI->_vptr_IDynLibrary = (_func_int **)local_28;
  (in_RDI->version).prefix[0] = '\0';
  (in_RDI->version).prefix[1] = '\0';
  (in_RDI->version).prefix[2] = '\0';
  (in_RDI->version).prefix[3] = '\0';
  (in_RDI->version).data = (anon_union_4_2_43ae805c_for_data)0x0;
  in_RDI->version = local_20;
  RVar1.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar1.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ref)RVar1.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IDynLibrary::Ref DynLibLinux::Create() {
    return std::make_shared<DynLibLinux>();
}